

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

int libj1939_socket_prio(int sock,int prio)

{
  uint __errnum;
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint in_ESI;
  int in_EDI;
  int ret;
  uint local_c [2];
  uint local_4;
  
  local_c[0] = in_ESI;
  iVar1 = setsockopt(in_EDI,0x6b,3,local_c,4);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    __stream = _stderr;
    __errnum = -*piVar2;
    pcVar3 = strerror(__errnum);
    fprintf(__stream,"Failed to set priority %i. Error %i (%s)",(ulong)local_c[0],(ulong)__errnum,
            pcVar3);
    local_4 = __errnum;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int libj1939_socket_prio(int sock, int prio)
{
	int ret;

	ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_SEND_PRIO,
			 &prio, sizeof(prio));
	if (ret < 0) {
		ret = -errno;
		pr_warn("Failed to set priority %i. Error %i (%s)", prio, ret,
			strerror(ret));
		return ret;
	}

	return 0;
}